

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

int __thiscall
google::protobuf::internal::EpsCopyInputStream::BytesAvailable(EpsCopyInputStream *this,char *ptr)

{
  char **v1;
  void **v2;
  char *pcVar1;
  LogMessage *pLVar2;
  LogMessage local_a8;
  Voidify local_95;
  int local_94;
  long local_90;
  Nullable<const_char_*> local_88;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  Voidify local_6d;
  int local_6c;
  long local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  ptrdiff_t available;
  LogMessage local_40;
  Voidify local_29;
  void *local_28;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  absl_log_internal_check_op_result = ptr;
  ptr_local = (char *)this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<char_const*>
                 (&absl_log_internal_check_op_result);
  local_28 = (void *)0x0;
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_28);
  local_20 = absl::lts_20250127::log_internal::Check_NEImpl<char_const*,decltype(nullptr)>
                       (v1,v2,"ptr != nullptr");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
               ,0x175,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  absl_log_internal_check_op_result_1 =
       this->buffer_end_ + (0x10 - (long)absl_log_internal_check_op_result);
  local_68 = absl::lts_20250127::log_internal::GetReferenceableValue
                       ((long)absl_log_internal_check_op_result_1);
  local_6c = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_60 = absl::lts_20250127::log_internal::Check_GEImpl<long,int>
                       (&local_68,&local_6c,"available >= 0");
  if (local_60 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_2,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
               ,0x177,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&absl_log_internal_check_op_result_2);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_6d,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_2);
  }
  local_90 = absl::lts_20250127::log_internal::GetReferenceableValue
                       ((long)absl_log_internal_check_op_result_1);
  local_94 = absl::lts_20250127::log_internal::GetReferenceableValue(0x7fffffff);
  local_88 = absl::lts_20250127::log_internal::Check_LEImpl<long,int>
                       (&local_90,&local_94,"available <= INT_MAX");
  if (local_88 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_88);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
               ,0x178,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_95,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_a8);
  }
  return (int)absl_log_internal_check_op_result_1;
}

Assistant:

int BytesAvailable(const char* ptr) const {
    ABSL_DCHECK_NE(ptr, nullptr);
    ptrdiff_t available = buffer_end_ + kSlopBytes - ptr;
    ABSL_DCHECK_GE(available, 0);
    ABSL_DCHECK_LE(available, INT_MAX);
    return static_cast<int>(available);
  }